

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImVector<ImGuiOldColumns>::clear_destruct(ImVector<ImGuiOldColumns> *this)

{
  int *piVar1;
  ImGuiOldColumns *pIVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  
  if (0 < this->Size) {
    lVar4 = 0x68;
    lVar5 = 0;
    do {
      pIVar2 = this->Data;
      ImDrawListSplitter::ClearFreeMemory((ImDrawListSplitter *)(&pIVar2->IsFirstFrame + lVar4));
      pvVar3 = *(void **)((long)&pIVar2->OffMaxX + lVar4);
      if (pvVar3 != (void *)0x0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar3,GImAllocatorUserData);
      }
      pvVar3 = *(void **)((long)&pIVar2->ID + lVar4);
      if (pvVar3 != (void *)0x0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar3,GImAllocatorUserData);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x88;
    } while (lVar5 < this->Size);
  }
  pIVar2 = this->Data;
  if (pIVar2 != (ImGuiOldColumns *)0x0) {
    this->Size = 0;
    this->Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    this->Data = (ImGuiOldColumns *)0x0;
  }
  return;
}

Assistant:

inline void         clear_delete()                      { for (int n = 0; n < Size; n++) IM_DELETE(Data[n]); clear(); }